

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::AccumLiteral
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,
          MatchLiteralNode *deferredLiteralNode,Node *charOrLiteralNode)

{
  CharCount CVar1;
  code *pcVar2;
  bool bVar3;
  CharCount size;
  CharCount CVar4;
  undefined4 *puVar5;
  
  if ((charOrLiteralNode->tag & ~BOL) != MatchLiteral) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x333,
                       "(charOrLiteralNode->tag == Node::MatchChar || charOrLiteralNode->tag == Node::MatchLiteral)"
                       ,
                       "charOrLiteralNode->tag == Node::MatchChar || charOrLiteralNode->tag == Node::MatchLiteral"
                      );
    if (!bVar3) goto LAB_00d1ac3e;
    *puVar5 = 0;
  }
  size = (**charOrLiteralNode->_vptr_Node)(charOrLiteralNode);
  if (size == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x335,"(addLen > 0)","addLen > 0");
    if (!bVar3) {
LAB_00d1ac3e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  CVar1 = deferredLiteralNode->length;
  if (CVar1 == 0) {
    EnsureLitbuf(this,size);
    deferredLiteralNode->offset = this->litbufNext;
    deferredLiteralNode->length = size;
    (*charOrLiteralNode->_vptr_Node[1])
              (charOrLiteralNode,&this->litbufNext,(ulong)this->litbufLen,this->litbuf);
    return;
  }
  CVar4 = deferredLiteralNode->offset + CVar1;
  if (CVar4 == this->litbufNext) {
    EnsureLitbuf(this,size);
  }
  else {
    if ((charOrLiteralNode->tag == MatchLiteral) &&
       (CVar4 == *(CharCount *)&charOrLiteralNode[1]._vptr_Node)) {
      deferredLiteralNode->length = CVar1 + size;
      return;
    }
    EnsureLitbuf(this,CVar1 + size);
    js_wmemcpy_s(this->litbuf + this->litbufNext,(ulong)(this->litbufLen - this->litbufNext),
                 this->litbuf + deferredLiteralNode->offset,(ulong)deferredLiteralNode->length);
    CVar1 = this->litbufNext;
    deferredLiteralNode->offset = CVar1;
    this->litbufNext = CVar1 + deferredLiteralNode->length;
  }
  (*charOrLiteralNode->_vptr_Node[1])
            (charOrLiteralNode,&this->litbufNext,(ulong)this->litbufLen,this->litbuf);
  deferredLiteralNode->length = deferredLiteralNode->length + size;
  return;
}

Assistant:

void Parser<P, IsLiteral>::AccumLiteral(MatchLiteralNode* deferredLiteralNode, Node* charOrLiteralNode)
    {
        Assert(charOrLiteralNode->tag == Node::MatchChar || charOrLiteralNode->tag == Node::MatchLiteral);
        CharCount addLen = charOrLiteralNode->LiteralLength();
        Assert(addLen > 0);

        if (deferredLiteralNode->length == 0)
        {
            // Start a new literal
            EnsureLitbuf(addLen);
            deferredLiteralNode->offset = litbufNext;
            deferredLiteralNode->length = addLen;
            charOrLiteralNode->AppendLiteral(litbufNext, litbufLen, litbuf);
        }
        else if (deferredLiteralNode->offset + deferredLiteralNode->length == litbufNext)
        {
            // Keep growing the current literal
            EnsureLitbuf(addLen);
            charOrLiteralNode->AppendLiteral(litbufNext, litbufLen, litbuf);
            deferredLiteralNode->length += addLen;

        }
        else if (charOrLiteralNode->tag == Node::MatchLiteral && deferredLiteralNode->offset + deferredLiteralNode->length == ((MatchLiteralNode*)charOrLiteralNode)->offset)
        {
            // Absorb next literal into current literal since they are adjacent
            deferredLiteralNode->length += addLen;
        }
        else
        {
            // Abandon current literal and start a fresh one (leaves gap)
            EnsureLitbuf(deferredLiteralNode->length + addLen);
            js_wmemcpy_s(litbuf + litbufNext, litbufLen - litbufNext, litbuf + deferredLiteralNode->offset, deferredLiteralNode->length);
            deferredLiteralNode->offset = litbufNext;
            litbufNext += deferredLiteralNode->length;
            charOrLiteralNode->AppendLiteral(litbufNext, litbufLen, litbuf);
            deferredLiteralNode->length += addLen;
        }
    }